

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void replay_read_option(char *token)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *in;
  nh_optvalue *local_250;
  nh_optvalue local_240;
  nh_optvalue value;
  char valbuf [256];
  char optname [256];
  char *buf;
  char *valstr;
  char *otype;
  char *name;
  char *token_local;
  
  pcVar2 = strchr(token + 1,0x3a);
  if (pcVar2 == (char *)0x0) {
    terminate();
  }
  *pcVar2 = '\0';
  pcVar3 = strchr(pcVar2 + 1,0x3a);
  if (pcVar3 != (char *)0x0) {
    in = pcVar3 + 1;
    *pcVar3 = '\0';
    base64_decode(token + 1,valbuf + 0xf8);
    switch(pcVar2[1]) {
    case 'a':
      iVar1 = base64_strlen(in);
      pcVar2 = (char *)calloc((long)(iVar1 + 1),1);
      base64_decode(in,pcVar2);
      local_240.ar = parse_autopickup_rules(pcVar2);
      free(pcVar2);
      break;
    case 'b':
      iVar1 = atoi(in);
      local_240.b = (char)iVar1;
      break;
    default:
      parse_error("Unrecognized option type");
    case 'e':
      __isoc99_sscanf(in,"%x",&local_240);
      break;
    case 'i':
      __isoc99_sscanf(in,"%d",&local_240);
      break;
    case 'm':
      iVar1 = base64_strlen(in);
      pcVar2 = (char *)calloc((long)(iVar1 + 1),1);
      base64_decode(in,pcVar2);
      local_240.mt = parse_msgtype_rules(pcVar2);
      free(pcVar2);
      break;
    case 's':
      base64_decode(in,&value.b);
      if (value.b == '\0') {
        local_250 = (nh_optvalue *)0x0;
      }
      else {
        local_250 = &value;
      }
      local_240.s = (char *)local_250;
    }
    nh_set_option(valbuf + 0xf8,local_240,'\0');
    return;
  }
  terminate();
}

Assistant:

static void replay_read_option(char *token)
{
    char *name, *otype, *valstr, *buf, optname[BUFSZ], valbuf[BUFSZ];
    union nh_optvalue value;
    
    name = token + 1;
    otype = strchr(name, ':');
    if (!otype)
	terminate();
    *otype++ = '\0';
    valstr = strchr(otype, ':');
    if (!valstr)
	terminate();
    *valstr++ = '\0';
    
    base64_decode(name, optname);
    
    switch (otype[0]) {
	case 's':
	    base64_decode(valstr, valbuf);
	    value.s = (valbuf[0] != '\0') ? valbuf : NULL;
	    break;
	case 'e':
	    sscanf(valstr, "%x", &value.e);
	    break;
	case 'i':
	    sscanf(valstr, "%d", &value.i);
	    break;
	case 'b':
	    value.b = atoi(valstr);
	    break;
	case 'a':
	    buf = calloc(base64_strlen(valstr) + 1, 1);
	    base64_decode(valstr, buf);
	    value.ar = parse_autopickup_rules(buf);
	    free(buf);
	    break;
	case 'm':
	    buf = calloc(base64_strlen(valstr) + 1, 1);
	    base64_decode(valstr, buf);
	    value.mt = parse_msgtype_rules(buf);
	    free(buf);
	    break;
	default:
	    parse_error("Unrecognized option type");
    }
    
    nh_set_option(optname, value, FALSE);
}